

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandQuaVar(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint iVar;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  uint fUniv;
  char *pcVar5;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  iVar = 0;
  Extra_UtilGetoptReset();
  fUniv = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Iuvh"), iVar2 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          iVar2 = Abc_NtkGetChoiceNum(pAVar3);
          if (iVar2 == 0) {
            pAVar3 = Abc_NtkStrash(pAVar3,0,1,0);
            iVar2 = Abc_NtkQuantify(pAVar3,fUniv,iVar,fVerbose);
            Abc_NtkCleanData(pAVar3);
            Abc_AigCleanup((Abc_Aig_t *)pAVar3->pManFunc);
            if (iVar2 != 0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
              return 0;
            }
            Abc_Print(-1,"Command has failed.\n");
            return 0;
          }
          pcVar4 = "This command cannot be applied to an AIG with choice nodes.\n";
        }
        iVar2 = -1;
        goto LAB_0022ee97;
      }
      if (iVar1 != 0x75) break;
      fUniv = fUniv ^ 1;
    }
    if (iVar1 != 0x49) goto LAB_0022ee11;
    if (argc <= globalUtilOptind) break;
    iVar = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)iVar < 0) {
LAB_0022ee11:
      iVar2 = -2;
      Abc_Print(-2,"usage: qvar [-I num] [-uvh]\n");
      Abc_Print(-2,"\t         quantifies one variable using the AIG\n");
      Abc_Print(-2,"\t-I num : the zero-based index of a variable to quantify [default = %d]\n",
                (ulong)iVar);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fUniv == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle universal quantification [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0022ee97:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_0022ee11;
}

Assistant:

int Abc_CommandQuaVar( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, iVar, fUniv, fVerbose, RetValue;
    extern int Abc_NtkQuantify( Abc_Ntk_t * pNtk, int fUniv, int iVar, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    iVar = 0;
    fUniv = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Iuvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            iVar = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iVar < 0 )
                goto usage;
            break;
        case 'u':
            fUniv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum( pNtk ) )
    {
        Abc_Print( -1, "This command cannot be applied to an AIG with choice nodes.\n" );
        return 1;
    }

    // get the strashed network
    pNtkRes = Abc_NtkStrash( pNtk, 0, 1, 0 );
    RetValue = Abc_NtkQuantify( pNtkRes, fUniv, iVar, fVerbose );
    // clean temporary storage for the cofactors
    Abc_NtkCleanData( pNtkRes );
    Abc_AigCleanup( (Abc_Aig_t *)pNtkRes->pManFunc );
    // check the result
    if ( !RetValue )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: qvar [-I num] [-uvh]\n" );
    Abc_Print( -2, "\t         quantifies one variable using the AIG\n" );
    Abc_Print( -2, "\t-I num : the zero-based index of a variable to quantify [default = %d]\n", iVar );
    Abc_Print( -2, "\t-u     : toggle universal quantification [default = %s]\n", fUniv? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}